

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

int find_attr_val(char *name,size_t name_len,char **val,size_t *val_len)

{
  int iVar1;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  char qu;
  char *p;
  bool local_33;
  char local_31;
  char *local_30;
  int local_4;
  
  if (*(char *)(in_RDI + in_RSI) == '=') {
    local_30 = (char *)(in_RDI + in_RSI) + 1;
    *in_RDX = (long)local_30;
    local_31 = '\0';
    while( true ) {
      local_33 = false;
      if (*local_30 != '\0') {
        iVar1 = isspace((int)*local_30);
        local_33 = iVar1 == 0 || local_31 != '\0';
      }
      if (!local_33) break;
      if ((local_31 == '\0') && ((*local_30 == '\"' || (*local_30 == '\'')))) {
        local_31 = *local_30;
      }
      else if (*local_30 == local_31) {
        local_31 = '\0';
      }
      local_30 = local_30 + 1;
    }
    *in_RCX = (long)local_30 - *in_RDX;
    local_4 = 1;
  }
  else {
    *in_RDX = in_RDI;
    *in_RCX = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int find_attr_val(const char *name, size_t name_len,
                         const char *&val, size_t &val_len)
{
    const char *p;

    /* go to the end of the attribute name */
    p = name + name_len;
    
    /* if there's an '=', there's a value */
    if (*p == '=')
    {
        /* the attribute value starts after the '=' */
        val = ++p;

        /* skip the token */
        for (char qu = 0 ; *p != 0 && (!isspace(*p) || qu != 0) ; ++p)
        {
            /* note if entering or leaving a quoted section */
            if (qu == 0 && (*p == '"' || *p == '\''))
                qu = *p;
            else if (*p == qu)
                qu = 0;
        }

        /* note the length of the value */
        val_len = p - val;

        /* there's an explicit value for this attribute */
        return TRUE;
    }
    else
    {
        /* the attribute name is its own implied value */
        val = name;
        val_len = name_len;

        /* there's no explicit value */
        return FALSE;
    }
}